

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O2

int __thiscall ncnn::Quantize::load_model(Quantize *this,ModelBin *mb)

{
  int *piVar1;
  Allocator *pAVar2;
  int iVar3;
  void *local_60;
  int *local_58;
  size_t local_50;
  int local_48;
  Allocator *local_40;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  int local_28;
  size_t local_20;
  
  (*mb->_vptr_ModelBin[2])(&local_60,mb,(ulong)(uint)this->scale_data_size,1);
  if (&this->scale_data != (Mat *)&local_60) {
    if (local_58 != (int *)0x0) {
      LOCK();
      *local_58 = *local_58 + 1;
      UNLOCK();
    }
    piVar1 = (this->scale_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pAVar2 = (this->scale_data).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->scale_data).data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->scale_data).data = local_60;
    (this->scale_data).refcount = local_58;
    (this->scale_data).elemsize = local_50;
    (this->scale_data).elempack = local_48;
    (this->scale_data).allocator = local_40;
    (this->scale_data).dims = local_38;
    (this->scale_data).w = iStack_34;
    (this->scale_data).h = iStack_30;
    (this->scale_data).d = iStack_2c;
    (this->scale_data).c = local_28;
    (this->scale_data).cstep = local_20;
  }
  if (local_58 != (int *)0x0) {
    LOCK();
    *local_58 = *local_58 + -1;
    UNLOCK();
    if (*local_58 == 0) {
      if (local_40 == (Allocator *)0x0) {
        free(local_60);
      }
      else {
        (*local_40->_vptr_Allocator[3])();
      }
    }
  }
  if (((this->scale_data).data == (void *)0x0) ||
     (iVar3 = 0, (long)(this->scale_data).c * (this->scale_data).cstep == 0)) {
    iVar3 = -100;
  }
  return iVar3;
}

Assistant:

int Quantize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}